

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeof.h
# Opt level: O3

void __thiscall
dap::BasicTypeInfo<dap::NextRequest>::~BasicTypeInfo(BasicTypeInfo<dap::NextRequest> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TypeInfo)._vptr_TypeInfo = (_func_int **)&PTR__BasicTypeInfo_00a4ef18;
  pcVar2 = (this->name_)._M_dataplus._M_p;
  paVar1 = &(this->name_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  TypeInfo::~TypeInfo(&this->super_TypeInfo);
  operator_delete(this,0x28);
  return;
}

Assistant:

constexpr BasicTypeInfo(std::string&& name) : name_(std::move(name)) {}